

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t type;
  size_t i;
  size_t sVar3;
  size_t argumentCount_00;
  anon_struct_56_7_e267023e gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_128;
  undefined8 local_118;
  undefined1 *local_110;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  anon_struct_136_2_7a050327_for_gcRoots *local_f0;
  sysbvm_functionCallFrameStack_t callFrameStack;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.argumentNode = 0;
  gcFrame.argument = 0;
  gcFrame.analysisFunction = 0;
  gcFrame.expansionResult = 0;
  gcFrame.functionOrMacro = 0;
  gcFrame.functionOrMacroExpressionType = 0;
  gcFrame.result = 0;
  local_128.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_128.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_128._12_4_ = 0;
  local_118 = 7;
  local_110 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_128);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.functionOrMacro =
       sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  gcFrame.functionOrMacroExpressionType = sysbvm_tuple_getType(context,gcFrame.functionOrMacro);
  type = sysbvm_tuple_getType(context,gcFrame.functionOrMacroExpressionType);
  gcFrame.analysisFunction =
       sysbvm_type_getAnalyzeAndEvaluateUnexpandedApplicationNodeOfWithEnvironmentFunction
                 (context,type);
  if (gcFrame.analysisFunction == 0) {
    _Var2 = sysbvm_function_isMacro((sysbvm_context_t *)gcFrame.functionOrMacro,type);
    if (_Var2) {
      gcFrame.expansionResult =
           sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
                     (context,arguments,&gcFrame.functionOrMacro,arguments + 1);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_128);
      gcFrame.result =
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                     (context,gcFrame.expansionResult,arguments[1]);
    }
    else {
      argumentCount_00 = 0;
      memset(&callFrameStack,0,0xb0);
      local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
      local_108._12_4_ = 0;
      local_f8 = 0x11;
      local_f0 = &callFrameStack.gcRoots;
      sysbvm_stackFrame_pushRecord(&local_108);
      uVar1 = *(ulong *)(*arguments + 0x30);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        argumentCount_00 = (size_t)(*(uint *)(uVar1 + 0xc) >> 3);
      }
      sysbvm_functionCallFrameStack_begin
                (context,&callFrameStack,gcFrame.functionOrMacro,argumentCount_00,0);
      for (sVar3 = 0; argumentCount_00 != sVar3; sVar3 = sVar3 + 1) {
        uVar1 = *(ulong *)(*arguments + 0x30);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          gcFrame.argumentNode = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar3 * 8);
        }
        else {
          gcFrame.argumentNode = 0;
        }
        gcFrame.argument =
             sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                       (context,gcFrame.argumentNode,arguments[1]);
        sysbvm_functionCallFrameStack_push(&callFrameStack,gcFrame.argument);
      }
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_128);
      gcFrame.result = sysbvm_functionCallFrameStack_finish(context,&callFrameStack);
    }
  }
  else {
    gcFrame.result =
         sysbvm_function_apply4
                   (context,gcFrame.analysisFunction,gcFrame.functionOrMacroExpressionType,
                    *arguments,gcFrame.functionOrMacro,arguments[1]);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_128);
  }
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    struct {
        sysbvm_tuple_t functionOrMacro;
        sysbvm_tuple_t functionOrMacroExpressionType;
        sysbvm_tuple_t analysisFunction;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedNode)->super.sourcePosition);

    gcFrame.functionOrMacro = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*unexpandedNode)->functionOrMacroExpression, *environment);
    gcFrame.functionOrMacroExpressionType = sysbvm_tuple_getType(context, gcFrame.functionOrMacro);
    gcFrame.analysisFunction = sysbvm_type_getAnalyzeAndEvaluateUnexpandedApplicationNodeOfWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.functionOrMacroExpressionType));
    if(gcFrame.analysisFunction)
    {
        gcFrame.result = sysbvm_function_apply4(context, gcFrame.analysisFunction, gcFrame.functionOrMacroExpressionType, (sysbvm_tuple_t)*unexpandedNode, gcFrame.functionOrMacro, *environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }

    bool isMacro = sysbvm_function_isMacro(context, gcFrame.functionOrMacro);
    if(isMacro)
    {
        gcFrame.expansionResult = sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(context, node, &gcFrame.functionOrMacro, environment);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
    }

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    size_t applicationArgumentCount = sysbvm_array_getSize((*unexpandedNode)->arguments);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.functionOrMacro, applicationArgumentCount, 0);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*unexpandedNode)->arguments, i);
        gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
    }

    //SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}